

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O0

int ffcalc_rng(fitsfile *infptr,char *expr,fitsfile *outfptr,char *parName,char *parInfo,int nRngs,
              long *start,long *end,int *status)

{
  int iVar1;
  int iVar2;
  ushort **ppuVar3;
  char *in_RCX;
  fitsfile *in_RDX;
  _func_int_long_long_long_long_int_iteratorCol_ptr_void_ptr *unaff_RBX;
  char *in_R8;
  int in_R9D;
  bool bVar4;
  bool bVar5;
  long unaff_retaddr;
  long in_stack_00000008;
  iteratorCol *in_stack_00000010;
  int in_stack_00000018;
  undefined4 in_stack_0000001c;
  long totaln;
  int i;
  int nPerLp;
  int anyNull;
  LONGLONG nullVal;
  ParseData lParse;
  char tdimKwd [9];
  char nullKwd [9];
  char tform [16];
  char card [81];
  Node *result;
  int colNo;
  int col_cnt;
  long width;
  long repeat;
  long naxes [5];
  long nelem;
  int newNullKwd;
  int typecode;
  int constant;
  int naxis;
  parseInfo Info;
  int *status_00;
  ParseData *lParse_00;
  ParseData *lParse_01;
  char *ttype;
  undefined4 in_stack_fffffffffffffd28;
  int in_stack_fffffffffffffd2c;
  int in_stack_fffffffffffffd30;
  int in_stack_fffffffffffffd34;
  fitsfile *in_stack_fffffffffffffd38;
  int in_stack_fffffffffffffd44;
  uint in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  int iVar6;
  int *in_stack_fffffffffffffd50;
  fitsfile *in_stack_fffffffffffffd58;
  _func_int_ParseData_ptr_char_ptr_void_ptr *in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd6c;
  fitsfile *in_stack_fffffffffffffd70;
  fitsfile *in_stack_fffffffffffffd78;
  Node *in_stack_fffffffffffffd90;
  int *in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffda4;
  int *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb4;
  int in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  char *in_stack_fffffffffffffdc0;
  fitsfile *in_stack_fffffffffffffdc8;
  int *in_stack_fffffffffffffdd0;
  long *in_stack_fffffffffffffdd8;
  ParseData *in_stack_fffffffffffffde0;
  int *in_stack_fffffffffffffde8;
  long *in_stack_fffffffffffffdf0;
  iteratorCol *in_stack_fffffffffffffdf8;
  DataInfo *in_stack_fffffffffffffe00;
  PixelFilter *in_stack_fffffffffffffe08;
  int *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  fitsfile *in_stack_fffffffffffffe38;
  char local_1a8 [96];
  int *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  fitsfile *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed4;
  long *in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  fitsfile *in_stack_fffffffffffffee8;
  long local_e8;
  int local_dc;
  int local_d4;
  int local_d0 [2];
  long local_c8;
  long local_b8;
  int local_b0;
  undefined1 *local_a8;
  int local_3c;
  char *local_38;
  char *local_30;
  fitsfile *local_28;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  bVar4 = false;
  if (*(int *)CONCAT44(in_stack_0000001c,in_stack_00000018) != 0) {
    return *(int *)CONCAT44(in_stack_0000001c,in_stack_00000018);
  }
  local_3c = in_R9D;
  local_38 = in_R8;
  local_30 = in_RCX;
  local_28 = in_RDX;
  memset(local_d0,0,0x90);
  lParse_00 = (ParseData *)&stack0xfffffffffffffee8;
  ttype = (char *)CONCAT44(in_stack_0000001c,in_stack_00000018);
  status_00 = &local_d4;
  lParse_01 = (ParseData *)&stack0xfffffffffffffd58;
  iVar1 = ffiprs((fitsfile *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                 in_stack_fffffffffffffdb4,(char *)in_stack_fffffffffffffda8,
                 in_stack_fffffffffffffda4,in_stack_fffffffffffffd98,
                 (long *)in_stack_fffffffffffffd90,in_stack_fffffffffffffdd0,
                 in_stack_fffffffffffffdd8,in_stack_fffffffffffffde0,in_stack_fffffffffffffde8);
  if (iVar1 != 0) {
    ffcprs(lParse_00);
    return *(int *)CONCAT44(in_stack_0000001c,in_stack_00000018);
  }
  bVar5 = -1 < local_e8;
  if (!bVar5) {
    local_e8 = -local_e8;
  }
  local_a8 = &stack0xfffffffffffffd58;
  iVar1 = 0;
  ffpmrk();
  ffgcno(in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,(char *)in_stack_fffffffffffffd60,
         &in_stack_fffffffffffffd58->HDUposition,in_stack_fffffffffffffd50);
  ffcmsg();
  if (*(int *)CONCAT44(in_stack_0000001c,in_stack_00000018) == 0) {
    if (*(int *)CONCAT44(in_stack_0000001c,in_stack_00000018) != 0) {
      ffcprs(lParse_00);
      return *(int *)CONCAT44(in_stack_0000001c,in_stack_00000018);
    }
    ffkeyn((char *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
           in_stack_fffffffffffffd44,(char *)in_stack_fffffffffffffd38,
           (int *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
    ffgcrd(in_stack_fffffffffffffe38,
           (char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
           in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    if (*(int *)CONCAT44(in_stack_0000001c,in_stack_00000018) == 0) {
      ffptdm(in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,in_stack_fffffffffffffee0,
             in_stack_fffffffffffffed8,(int *)CONCAT44(in_stack_fffffffffffffed4,iVar1));
    }
    else if (*(int *)CONCAT44(in_stack_0000001c,in_stack_00000018) == 0xca) {
      *(undefined4 *)CONCAT44(in_stack_0000001c,in_stack_00000018) = 0;
      ffcmsg();
      if (1 < local_d4) {
        ffptdm(in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,in_stack_fffffffffffffee0,
               in_stack_fffffffffffffed8,(int *)CONCAT44(in_stack_fffffffffffffed4,iVar1));
      }
    }
    if (*(int *)CONCAT44(in_stack_0000001c,in_stack_00000018) != 0) {
      ffcprs(lParse_00);
      return *(int *)CONCAT44(in_stack_0000001c,in_stack_00000018);
    }
  }
  else {
    *(undefined4 *)CONCAT44(in_stack_0000001c,in_stack_00000018) = 0;
    if (*local_30 == '#') {
      if (bVar5) {
        ffcprs(lParse_00);
        ffpmsg((char *)0x142564);
        *(undefined4 *)CONCAT44(in_stack_0000001c,in_stack_00000018) = 0x1b0;
        return 0x1b0;
      }
      local_30 = local_30 + 1;
      iVar2 = fits_strcasecmp((char *)lParse_01,(char *)lParse_00);
      if (((iVar2 == 0) ||
          (iVar2 = fits_strcasecmp((char *)lParse_01,(char *)lParse_00), iVar2 == 0)) &&
         (local_d0[0] != 0x10)) {
        ffcprs(lParse_00);
        ffpmsg((char *)0x1425e8);
        *(undefined4 *)CONCAT44(in_stack_0000001c,in_stack_00000018) = 0x1b0;
        return 0x1b0;
      }
    }
    else if (bVar5) {
      iVar1 = -1;
    }
    else {
      iVar2 = ffgcrd(in_stack_fffffffffffffe38,
                     (char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                     in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
      if (iVar2 == 0xca) {
        iVar1 = -1;
      }
      else if (*(int *)CONCAT44(in_stack_0000001c,in_stack_00000018) != 0) {
        ffcprs(lParse_00);
        return *(int *)CONCAT44(in_stack_0000001c,in_stack_00000018);
      }
    }
    if (iVar1 < 0) {
      *(undefined4 *)CONCAT44(in_stack_0000001c,in_stack_00000018) = 0;
      ffgncl((fitsfile *)lParse_01,(int *)lParse_00,status_00);
      iVar1 = iVar1 + 1;
      if ((local_38 == (char *)0x0) || (*local_38 == '\0')) {
        if (in_stack_fffffffffffffe34 == 2) {
          snprintf(local_1a8,0xf,"%ld",local_e8);
          in_stack_fffffffffffffd34 = local_d0[0];
          if (local_d0[0] == 1) {
            strcat(local_1a8,"X");
          }
          else if (local_d0[0] == 0xe) {
            strcat(local_1a8,"L");
          }
          else if (local_d0[0] == 0x10) {
            strcat(local_1a8,"A");
          }
          else if (local_d0[0] == 0x29) {
            strcat(local_1a8,"J");
          }
          else if (local_d0[0] == 0x51) {
            strcat(local_1a8,"K");
          }
          else if (local_d0[0] == 0x52) {
            strcat(local_1a8,"D");
          }
        }
        else {
          in_stack_fffffffffffffd30 = local_d0[0];
          if (local_d0[0] != 1) {
            if (local_d0[0] == 0xe) {
              ffcprs(lParse_00);
              ffpmsg((char *)0x142858);
              *(undefined4 *)CONCAT44(in_stack_0000001c,in_stack_00000018) = 0xe3;
              return 0xe3;
            }
            if (local_d0[0] != 0x10) {
              if (local_d0[0] == 0x29) {
                strcpy(local_1a8,"I11");
              }
              else if (local_d0[0] == 0x52) {
                strcpy(local_1a8,"D23.15");
              }
              goto LAB_001428c7;
            }
          }
          snprintf(local_1a8,0x10,"A%ld",local_e8);
        }
LAB_001428c7:
        local_38 = local_1a8;
      }
      else {
        ppuVar3 = __ctype_b_loc();
        if ((((*ppuVar3)[(int)*local_38] & 0x800) == 0) && (in_stack_fffffffffffffe34 == 2)) {
          if ((local_d0[0] == 1) && (*local_38 == 'B')) {
            local_e8 = (local_e8 + 7) / 8;
          }
          snprintf(local_1a8,0x10,"%ld%s",local_e8,local_38);
          local_38 = local_1a8;
        }
      }
      fficol((fitsfile *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
             in_stack_fffffffffffffd2c,ttype,(char *)lParse_01,(int *)lParse_00);
      if (1 < local_d4) {
        ffptdm(in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,in_stack_fffffffffffffee0,
               in_stack_fffffffffffffed8,(int *)CONCAT44(in_stack_fffffffffffffed4,iVar1));
      }
      ffkeyn((char *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
             in_stack_fffffffffffffd44,(char *)in_stack_fffffffffffffd38,
             (int *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
      iVar2 = ffgcrd(in_stack_fffffffffffffe38,
                     (char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                     in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
      if (iVar2 == 0xca) {
        *(undefined4 *)CONCAT44(in_stack_0000001c,in_stack_00000018) = 0;
        if (in_stack_fffffffffffffe34 == 2) {
          in_stack_fffffffffffffd50 = (int *)0x0;
          ffbnfm((char *)in_stack_fffffffffffffe08,(int *)in_stack_fffffffffffffe00,
                 (long *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                 in_stack_fffffffffffffde8);
          if (local_dc == 0xb) {
            in_stack_fffffffffffffd50 = (int *)0xff;
          }
          else if (local_dc == 0x15) {
            in_stack_fffffffffffffd50 = (int *)0xffffffffffff8000;
          }
          else if (local_dc == 0x1f) {
            in_stack_fffffffffffffd50 = (int *)0xffffffff80000000;
          }
          else if (local_dc == 0x29) {
            in_stack_fffffffffffffd50 = (int *)0xffffffff80000000;
          }
          else if (local_dc == 0x51) {
            in_stack_fffffffffffffd50 = (int *)0x8000000000000000;
          }
          bVar4 = in_stack_fffffffffffffd50 != (int *)0x0;
          if (bVar4) {
            ffpkyj(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                   CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                   (char *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                   in_stack_fffffffffffffda8);
            fftnul((fitsfile *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                   (int)((ulong)ttype >> 0x20),(LONGLONG)lParse_01,(int *)lParse_00);
          }
        }
        else {
          bVar4 = in_stack_fffffffffffffe34 == 1;
          if (bVar4) {
            ffpkys(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                   (char *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                   (char *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                   in_stack_fffffffffffffda8);
            ffsnul((fitsfile *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                   (int)((ulong)ttype >> 0x20),(char *)lParse_01,(int *)lParse_00);
          }
        }
      }
    }
  }
  if (0 < iVar1) {
    iVar6 = 0;
    ffgkyj((fitsfile *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
           (char *)in_stack_fffffffffffffd60,(long *)in_stack_fffffffffffffd58,
           (char *)in_stack_fffffffffffffd50,(int *)(ulong)in_stack_fffffffffffffd48);
    iVar2 = fits_parser_allocateCol(lParse_01,(int)((ulong)lParse_00 >> 0x20),status_00);
    if (iVar2 != 0) {
      ffcprs(lParse_00);
      return *(int *)CONCAT44(in_stack_0000001c,in_stack_00000018);
    }
    fits_iter_set_by_num(in_stack_fffffffffffffdf8 + in_stack_fffffffffffffdb8,local_28,iVar1,0,2);
    for (iVar1 = 0; iVar1 < local_3c; iVar1 = iVar1 + 1) {
      local_c8 = 0;
      local_b8 = (*(long *)(in_stack_00000010->colname + (long)iVar1 * 8 + -0xc) -
                 *(long *)(in_stack_00000008 + (long)iVar1 * 8)) + 1;
      iVar2 = ffiter(in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,unaff_RBX,
                     (void *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                     (int *)totaln);
      if (iVar2 == -1) {
        *(undefined4 *)CONCAT44(in_stack_0000001c,in_stack_00000018) = 0;
      }
      else if (*(int *)CONCAT44(in_stack_0000001c,in_stack_00000018) != 0) {
        ffcprs(lParse_00);
        return *(int *)CONCAT44(in_stack_0000001c,in_stack_00000018);
      }
      if (local_b0 != 0) {
        iVar6 = 1;
      }
    }
    if ((bVar4) && (iVar6 == 0)) {
      ffdkey(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    }
    goto LAB_00143130;
  }
  if (local_d0[0] != 1) {
    if (local_d0[0] == 0xe) {
      ffukyl((fitsfile *)CONCAT44(0xe,in_stack_fffffffffffffd28),ttype,
             (int)((ulong)lParse_01 >> 0x20),(char *)lParse_00,status_00);
      goto LAB_00143130;
    }
    if (local_d0[0] != 0x10) {
      if (local_d0[0] == 0x29) {
        ffukyj((fitsfile *)CONCAT44(0x29,in_stack_fffffffffffffd28),ttype,(LONGLONG)lParse_01,
               (char *)lParse_00,status_00);
      }
      else if (local_d0[0] == 0x52) {
        ffukyd(in_stack_fffffffffffffd38,
               (char *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
               (double)CONCAT44(0x52,in_stack_fffffffffffffd28),(int)((ulong)ttype >> 0x20),
               (char *)lParse_01,(int *)lParse_00);
      }
      goto LAB_00143130;
    }
  }
  iVar1 = fits_strcasecmp((char *)lParse_01,(char *)lParse_00);
  if (iVar1 == 0) {
    ffphis(in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffd70,
           (int *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  }
  else {
    iVar1 = fits_strcasecmp((char *)lParse_01,(char *)lParse_00);
    if (iVar1 == 0) {
      ffpcom(in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffd70,
             (int *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    }
    else {
      ffukys((fitsfile *)CONCAT44(local_d0[0],in_stack_fffffffffffffd28),ttype,(char *)lParse_01,
             (char *)lParse_00,status_00);
    }
  }
LAB_00143130:
  ffcprs(lParse_00);
  return *(int *)CONCAT44(in_stack_0000001c,in_stack_00000018);
}

Assistant:

int ffcalc_rng( fitsfile *infptr,   /* I - Input FITS file                  */
                char     *expr,     /* I - Arithmetic expression            */
                fitsfile *outfptr,  /* I - Output fits file                 */
                char     *parName,  /* I - Name of output parameter         */
                char     *parInfo,  /* I - Extra information on parameter   */
                int      nRngs,     /* I - Row range info                   */
                long     *start,    /* I - Row range info                   */
                long     *end,      /* I - Row range info                   */
                int      *status )  /* O - Error status                     */
/*                                                                          */
/* Evaluate an expression using the data in the input FITS file and place   */
/* the results into either a column or keyword in the output fits file,     */
/* depending on the value of parName (keywords normally prefixed with '#')  */
/* and whether the expression evaluates to a constant or a table column.    */
/* The logic is as follows:                                                 */
/*    (1) If a column exists with name, parName, put results there.         */
/*    (2) If parName starts with '#', as in #NAXIS, put result there,       */
/*        with parInfo used as the comment. If expression does not evaluate */
/*        to a constant, flag an error.                                     */
/*    (3) If a keyword exists with name, parName, and expression is a       */
/*        constant, put result there, using parInfo as the new comment.     */
/*    (4) Else, create a new column with name parName and TFORM parInfo.    */
/*        If parInfo is NULL, use a default data type for the column.       */
/*--------------------------------------------------------------------------*/
{
   parseInfo Info;
   int naxis, constant, typecode, newNullKwd=0;
   long nelem, naxes[MAXDIMS], repeat, width;
   int col_cnt, colNo;
   Node *result;
   char card[81], tform[16], nullKwd[9], tdimKwd[9];
   ParseData lParse;

   if( *status ) return( *status );

   memset(&Info, 0, sizeof(Info));   

   if( ffiprs( infptr, 0, expr, MAXDIMS, &Info.datatype, &nelem, &naxis,
               naxes, &lParse, status ) ) {

      ffcprs(&lParse);
      return( *status );
   }
   if( nelem<0 ) {
      constant = 1;
      nelem = -nelem;
   } else
      constant = 0;

   Info.parseData = &lParse;
   /*  Case (1): If column exists put it there  */

   colNo = 0;
   ffpmrk(); /* prevent lack of column name from sullying the stack */
   ffgcno( outfptr, CASEINSEN, parName, &colNo, status );
   ffcmsg();   
   if( *status ) {

      /*  Output column doesn't exist.  Test for keyword. */

      /* Case (2): Does parName indicate result should be put into keyword */

      *status = 0;
      if( parName[0]=='#' ) {
         if( ! constant ) {
            ffcprs(&lParse);
            ffpmsg( "Cannot put tabular result into keyword (ffcalc)" );
            return( *status = PARSE_BAD_TYPE );
         }
         parName++;  /* Advance past '#' */
	 if ( (fits_strcasecmp(parName,"HISTORY") == 0 || fits_strcasecmp(parName,"COMMENT") == 0) &&
	      Info.datatype != TSTRING ) {
            ffcprs(&lParse);
            ffpmsg( "HISTORY and COMMENT values must be strings (ffcalc)" );
	    return( *status = PARSE_BAD_TYPE );
	 }

      } else if( constant ) {

         /* Case (3): Does a keyword named parName already exist */

         if( ffgcrd( outfptr, parName, card, status )==KEY_NO_EXIST ) {
            colNo = -1;
         } else if( *status ) {
            ffcprs(&lParse);
            return( *status );
         }

      } else
         colNo = -1;

      if( colNo<0 ) {

         /* Case (4): Create new column */

         *status = 0;
         ffgncl( outfptr, &colNo, status );
         colNo++;
         if( parInfo==NULL || *parInfo=='\0' ) {
            /*  Figure out best default column type  */
            if( lParse.hdutype==BINARY_TBL ) {
               snprintf(tform,15,"%ld",nelem);
               switch( Info.datatype ) {
               case TLOGICAL:  strcat(tform,"L");  break;
               case TLONG:     strcat(tform,"J");  break;
               case TDOUBLE:   strcat(tform,"D");  break;
               case TSTRING:   strcat(tform,"A");  break;
               case TBIT:      strcat(tform,"X");  break;
               case TLONGLONG: strcat(tform,"K");  break;
               }
            } else {
               switch( Info.datatype ) {
               case TLOGICAL:
                  ffcprs(&lParse);
                  ffpmsg("Cannot create LOGICAL column in ASCII table");
                  return( *status = NOT_BTABLE );
               case TLONG:     strcpy(tform,"I11");     break;
               case TDOUBLE:   strcpy(tform,"D23.15");  break;
               case TSTRING:   
               case TBIT:      snprintf(tform,16,"A%ld",nelem);  break;
               }
            }
            parInfo = tform;
         } else if( !(isdigit((int) *parInfo)) && lParse.hdutype==BINARY_TBL ) {
            if( Info.datatype==TBIT && *parInfo=='B' )
               nelem = (nelem+7)/8;
            snprintf(tform,16,"%ld%s",nelem,parInfo);
            parInfo = tform;
         }
         fficol( outfptr, colNo, parName, parInfo, status );
         if( naxis>1 )
            ffptdm( outfptr, colNo, naxis, naxes, status );

         /*  Setup TNULLn keyword in case NULLs are encountered  */

         ffkeyn("TNULL", colNo, nullKwd, status);
         if( ffgcrd( outfptr, nullKwd, card, status )==KEY_NO_EXIST ) {
            *status = 0;
            if( lParse.hdutype==BINARY_TBL ) {
	       LONGLONG nullVal=0;
               fits_binary_tform( parInfo, &typecode, &repeat, &width, status );
               if( typecode==TBYTE )
                  nullVal = UCHAR_MAX;
               else if( typecode==TSHORT )
                  nullVal = SHRT_MIN;
               else if( typecode==TINT )
                  nullVal = INT_MIN;
               else if( typecode==TLONG ) {
                  if (sizeof(long) == 8 && sizeof(int) == 4)
                     nullVal = INT_MIN;
                  else
                     nullVal = LONG_MIN;
               }
               else if( typecode==TLONGLONG )
                  nullVal = LONGLONG_MIN;
		  
               if( nullVal ) {
                  ffpkyj( outfptr, nullKwd, nullVal, "Null value", status );
                  fits_set_btblnull( outfptr, colNo, nullVal, status );
                  newNullKwd = 1;
               }
            } else if( lParse.hdutype==ASCII_TBL ) {
               ffpkys( outfptr, nullKwd, "NULL", "Null value string", status );
               fits_set_atblnull( outfptr, colNo, "NULL", status );
               newNullKwd = 1;
            }
         }

      }

   } else if( *status ) {
      ffcprs(&lParse);
      return( *status );
   } else {

      /********************************************************/
      /*  Check if a TDIM keyword should be written/updated.  */
      /********************************************************/

      ffkeyn("TDIM", colNo, tdimKwd, status);
      ffgcrd( outfptr, tdimKwd, card, status );
      if( *status==0 ) {
         /*  TDIM exists, so update it with result's dimension  */
         ffptdm( outfptr, colNo, naxis, naxes, status );
      } else if( *status==KEY_NO_EXIST ) {
         /*  TDIM does not exist, so clear error stack and     */
         /*  write a TDIM only if result is multi-dimensional  */
         *status = 0;
         ffcmsg();
         if( naxis>1 )
            ffptdm( outfptr, colNo, naxis, naxes, status );
      }
      if( *status ) {
         /*  Either some other error happened in ffgcrd   */
         /*  or one happened in ffptdm                    */
         ffcprs(&lParse);
         return( *status );
      }

   }

   if( colNo>0 ) {

      /*  Output column exists (now)... put results into it  */

      int anyNull = 0;
      int nPerLp, i;
      long totaln;

      ffgkyj(infptr, "NAXIS2", &totaln, 0, status);

      /*************************************/
      /* Create new iterator Output Column */
      /*************************************/

      col_cnt = lParse.nCols;
      if( fits_parser_allocateCol( &lParse, col_cnt, status ) ) {
         ffcprs(&lParse);
         return( *status );
      }

      fits_iter_set_by_num( lParse.colData+col_cnt, outfptr,
                            colNo, 0, OutputCol );
      lParse.nCols++;

      for( i=0; i<nRngs; i++ ) {
         Info.dataPtr = NULL;
         Info.maxRows = end[i]-start[i]+1;

          /*
            If there is only 1 range, and it includes all the rows,
            and there are 10 or more rows, then set nPerLp = 0 so
            that the iterator function will dynamically choose the
            most efficient number of rows to process in each loop.
            Otherwise, set nPerLp to the number of rows in this range.
         */

         if( (Info.maxRows >= 10) && (nRngs == 1) &&
             (start[0] == 1) && (end[0] == totaln))
              nPerLp = 0;
         else
              nPerLp = Info.maxRows;

         if( ffiter( lParse.nCols, lParse.colData, start[i]-1,
                     nPerLp, fits_parser_workfn, (void*)&Info, status ) == -1 )
            *status = 0;
         else if( *status ) {
            ffcprs(&lParse);
            return( *status );
         }
         if( Info.anyNull ) anyNull = 1;
      }

      if( newNullKwd && !anyNull ) {
         ffdkey( outfptr, nullKwd, status );
      }

   } else {

      /* Put constant result into keyword */

      result  = lParse.Nodes + lParse.resultNode;
      switch( Info.datatype ) {
      case TDOUBLE:
         ffukyd( outfptr, parName, result->value.data.dbl, 15,
                 parInfo, status );
         break;
      case TLONG:
         ffukyj( outfptr, parName, result->value.data.lng, parInfo, status );
         break;
      case TLOGICAL:
         ffukyl( outfptr, parName, result->value.data.log, parInfo, status );
         break;
      case TBIT:
      case TSTRING:
	 if (fits_strcasecmp(parName,"HISTORY") == 0) {
	   ffphis( outfptr, result->value.data.str, status);
	 } else if (fits_strcasecmp(parName,"COMMENT") == 0) {
	   ffpcom( outfptr, result->value.data.str, status);
	 } else {
	   ffukys( outfptr, parName, result->value.data.str, parInfo, status );
	 }
         break;
      }
   }

   ffcprs(&lParse);
   return( *status );
}